

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

uint32_t leb_EncodeNode(leb_Heap *leb,leb_Node node)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  leb_Node node_00;
  
  if (((ulong)node & 0xfffffffe) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      node_00 = (leb_Node)((ulong)node & 0xfffffffffffffffe);
      if (node.id == node.depth) {
        node_00 = node;
      }
      uVar2 = leb__HeapRead(leb,node_00);
      if (((ulong)node & 1) == 0) {
        uVar2 = 0;
      }
      uVar3 = uVar3 + uVar2;
      uVar1 = (ulong)node & 0xfffffffc;
      node = (leb_Node)
             (((ulong)node & 0xffffffff00000000) - 0x100000000 | (ulong)node >> 1 & 0x7fffffff);
    } while (uVar1 != 0);
  }
  return uVar3;
}

Assistant:

LEBDEF uint32_t leb_EncodeNode(const leb_Heap *leb, const leb_Node node)
{
    uint32_t nodeID = 0u;
    leb_Node nodeIterator = node;

    while (nodeIterator.id > 1u) {
        leb_Node sibling = leb__LeftSiblingNode(nodeIterator);
        uint32_t nodeCount = leb__HeapRead(leb, {sibling.id, sibling.depth});

        nodeID+= (nodeIterator.id & 1u) * nodeCount;
        nodeIterator = leb__ParentNode_Fast(nodeIterator);
    }

    return nodeID;
}